

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

void DoAttack(AActor *self,bool domelee,bool domissile,int MeleeDamage,FSoundID *MeleeSound,
             PClassActor *MissileType,double MissileHeight)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  double dVar7;
  int local_ac;
  TFlags<ActorFlag2,_unsigned_int> local_74;
  DVector3 local_70;
  AActor *local_58;
  AActor *missile;
  double add;
  FName local_40;
  int local_3c;
  FSoundID local_38;
  int newdam;
  double dStack_30;
  int damage;
  double MissileHeight_local;
  PClassActor *MissileType_local;
  FSoundID *MeleeSound_local;
  int MeleeDamage_local;
  bool domissile_local;
  bool domelee_local;
  AActor *self_local;
  
  dStack_30 = MissileHeight;
  MissileHeight_local = (double)MissileType;
  MissileType_local = (PClassActor *)MeleeSound;
  MeleeSound_local._0_4_ = MeleeDamage;
  MeleeSound_local._6_1_ = domissile;
  MeleeSound_local._7_1_ = domelee;
  _MeleeDamage_local = self;
  bVar2 = TObjPtr<AActor>::operator==(&self->target,(AActor *)0x0);
  if (!bVar2) {
    A_FaceTarget(_MeleeDamage_local);
    if ((((MeleeSound_local._7_1_ & 1) == 0) || ((int)MeleeSound_local < 1)) ||
       (bVar2 = AActor::CheckMeleeRange(_MeleeDamage_local), !bVar2)) {
      dVar1 = dStack_30;
      if (((MeleeSound_local._6_1_ & 1) != 0) && (MissileHeight_local != 0.0)) {
        dVar7 = AActor::GetBobOffset(_MeleeDamage_local,0.0);
        missile = (AActor *)((dVar1 + dVar7) - 32.0);
        AActor::AddZ(_MeleeDamage_local,(double)missile,true);
        AActor::PosPlusZ(&local_70,_MeleeDamage_local,32.0);
        pAVar5 = _MeleeDamage_local;
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_MeleeDamage_local->target);
        local_58 = P_SpawnMissileXYZ(&local_70,pAVar5,pAVar6,(PClassActor *)MissileHeight_local,
                                     false,(AActor *)0x0);
        AActor::AddZ(_MeleeDamage_local,-(double)missile,true);
        if (local_58 != (AActor *)0x0) {
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_74,(int)local_58 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
          if (uVar4 != 0) {
            (local_58->tracer).field_0 = (_MeleeDamage_local->target).field_0;
          }
          P_CheckMissileSpawn(local_58,_MeleeDamage_local->radius);
        }
      }
    }
    else {
      newdam = FRandom::HitDice(&pr_camelee,(int)MeleeSound_local);
      iVar3 = FSoundID::operator_cast_to_int(MeleeSound);
      pAVar5 = _MeleeDamage_local;
      if (iVar3 != 0) {
        FSoundID::FSoundID(&local_38,MeleeSound);
        S_Sound(pAVar5,1,&local_38,1.0,1.0);
      }
      pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_MeleeDamage_local->target);
      pAVar5 = _MeleeDamage_local;
      iVar3 = newdam;
      FName::FName(&local_40,NAME_Melee);
      TAngle<double>::TAngle((TAngle<double> *)&add,0.0);
      local_3c = P_DamageMobj(pAVar6,pAVar5,pAVar5,iVar3,&local_40,0,(DAngle *)&add);
      local_ac = local_3c;
      if (local_3c < 1) {
        local_ac = newdam;
      }
      pAVar5 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_MeleeDamage_local->target);
      P_TraceBleed(local_ac,pAVar5,_MeleeDamage_local);
    }
  }
  return;
}

Assistant:

static void DoAttack (AActor *self, bool domelee, bool domissile,
					  int MeleeDamage, FSoundID MeleeSound, PClassActor *MissileType,double MissileHeight)
{
	if (self->target == NULL) return;

	A_FaceTarget (self);
	if (domelee && MeleeDamage>0 && self->CheckMeleeRange ())
	{
		int damage = pr_camelee.HitDice(MeleeDamage);
		if (MeleeSound) S_Sound (self, CHAN_WEAPON, MeleeSound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else if (domissile && MissileType != NULL)
	{
		// This seemingly senseless code is needed for proper aiming.
		double add = MissileHeight + self->GetBobOffset() - 32;
		self->AddZ(add);
		AActor *missile = P_SpawnMissileXYZ (self->PosPlusZ(32.), self, self->target, MissileType, false);
		self->AddZ(-add);

		if (missile)
		{
			// automatic handling of seeker missiles
			if (missile->flags2&MF2_SEEKERMISSILE)
			{
				missile->tracer=self->target;
			}
			P_CheckMissileSpawn(missile, self->radius);
		}
	}
}